

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::StoreVariableOperator> *op)

{
  UserDefinedVariableName name;
  element_type *peVar1;
  ostream *ostream;
  string *this_00;
  ostream *poVar2;
  Visitor<__int128> *this_01;
  _Optional_payload_base<int> in_RDI;
  int value;
  ostream *in_stack_ffffffffffffff98;
  shared_ptr<const_calc4::Operator> *in_stack_ffffffffffffffa8;
  VariableName local_3c;
  string_view local_38;
  UserDefinedVariableName local_28;
  int local_14;
  
  peVar1 = std::
           __shared_ptr_access<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1385c2);
  StoreVariableOperator::GetOperand(peVar1);
  local_14 = ProcessOperator((Visitor<__int128> *)in_RDI,in_stack_ffffffffffffffa8);
  ostream = Append((Visitor<__int128> *)in_RDI);
  peVar1 = std::
           __shared_ptr_access<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::StoreVariableOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1385f4);
  this_00 = StoreVariableOperator::GetVariableName_abi_cxx11_(peVar1);
  local_38 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  UserDefinedVariableName::UserDefinedVariableName(&local_28,local_38);
  name.name._M_str = (char *)in_RDI;
  name.name._M_len = (size_t)in_stack_ffffffffffffffa8;
  poVar2 = anon_unknown_0::operator<<(ostream,name);
  this_01 = (Visitor<__int128> *)std::operator<<(poVar2," = ");
  VariableName::VariableName(&local_3c,local_14);
  poVar2 = anon_unknown_0::operator<<
                     (in_stack_ffffffffffffff98,(VariableName)(int)((ulong)ostream >> 0x20));
  poVar2 = std::operator<<(poVar2,';');
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::optional<int>::optional<int_&,_true>
            ((optional<int> *)ostream,(int *)in_stack_ffffffffffffff98);
  Return(this_01,(optional<int>)in_RDI);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const StoreVariableOperator>& op) override
    {
        int value = ProcessOperator(op->GetOperand());
        Append() << UserDefinedVariableName(op->GetVariableName()) << " = " << VariableName(value)
                 << ';' << std::endl;
        Return(value);
    }